

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void DDecalSlider::InPlaceConstructor(void *mem)

{
  DDecalThinker::DDecalThinker((DDecalThinker *)mem);
  *(undefined ***)mem = &PTR_StaticType_006ece58;
  return;
}

Assistant:

void DDecalSlider::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("starttime", TimeToStart)
		("endtime", TimeToStop)
		("disty", DistY)
		("starty", StartY)
		("started", bStarted);
}